

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O1

parser_error parse_act_name(parser *p)

{
  char *pcVar1;
  void *pvVar2;
  undefined8 *v;
  
  pcVar1 = parser_getstr(p,"name");
  pvVar2 = parser_priv(p);
  v = (undefined8 *)mem_zalloc(0x38);
  *v = pvVar2;
  parser_setpriv(p,v);
  pcVar1 = string_make(pcVar1);
  v[1] = pcVar1;
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_act_name(struct parser *p) {
	const char *name = parser_getstr(p, "name");
	struct activation *h = parser_priv(p);

	struct activation *act = mem_zalloc(sizeof *act);
	act->next = h;
	parser_setpriv(p, act);
	act->name = string_make(name);

	return PARSE_ERROR_NONE;
}